

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

HeapType __thiscall
wasm::SExpressionWasmBuilder::getFunctionType(SExpressionWasmBuilder *this,Name name,Element *s)

{
  bool bVar1;
  ParseException *this_00;
  pointer ppVar2;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Self local_40;
  _Self local_38;
  iterator iter;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  iter._M_node = (_Base_ptr)s;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
       ::find(&this->functionTypes,(key_type *)&this_local);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::HeapType,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::HeapType>_>_>
       ::end(&this->functionTypes);
  bVar1 = std::operator==(&local_38,&local_40);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::HeapType>_>::operator->
                       (&local_38);
    return (HeapType)(ppVar2->second).id;
  }
  this_00 = (ParseException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_81);
  std::operator+(&local_60,"invalid call target: ",&local_80);
  ParseException::ParseException
            (this_00,&local_60,*(size_t *)(iter._M_node + 2),(size_t)iter._M_node[2]._M_parent);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

HeapType SExpressionWasmBuilder::getFunctionType(Name name, Element& s) {
  auto iter = functionTypes.find(name);
  if (iter == functionTypes.end()) {
    throw ParseException(
      "invalid call target: " + std::string(name.str), s.line, s.col);
  }
  return iter->second;
}